

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O1

string * __thiscall
r_comp::Decompiler::get_variable_name_abi_cxx11_
          (string *__return_storage_ptr__,Decompiler *this,uint16_t index,bool postfix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  mapped_type *pmVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  string s;
  char buffer [255];
  uint16_t local_14a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  char local_128 [256];
  
  paVar1 = &local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  uVar2 = (this->variable_names)._M_h._M_bucket_count;
  uVar5 = (CONCAT62(in_register_00000012,index) & 0xffffffff) % uVar2;
  p_Var6 = (this->variable_names)._M_h._M_buckets[uVar5 & 0xffffffff];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(uint16_t *)&p_Var6->_M_nxt[1]._M_nxt != index)) {
    while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(ushort *)&p_Var3[1]._M_nxt % uVar2 != uVar5) ||
         (p_Var7 = p_Var6, *(ushort *)&p_Var3[1]._M_nxt == index)) goto LAB_00131803;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00131803:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var7->_M_nxt;
  }
  local_14a = index;
  local_148._M_dataplus._M_p = (pointer)paVar1;
  if (p_Var3 == (_Hash_node_base *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_148,0,(char *)0x0,0x13fcb4);
    this->last_variable_id = this->last_variable_id + 1;
    sprintf(local_128,"%d");
    std::__cxx11::string::append((char *)&local_148);
    pmVar4 = std::__detail::
             _Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->variable_names,&local_14a);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    if (postfix) {
      std::__cxx11::string::push_back((char)&local_148);
    }
    OutStream::insert<std::__cxx11::string>(this->out_stream,(ulong)local_14a,&local_148);
    if (postfix) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_148);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                      local_148.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_148.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_148._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                      local_148.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_148._M_string_length;
      local_148._M_string_length = 0;
      local_148.field_2._M_local_buf[0] = '\0';
      local_148._M_dataplus._M_p = (pointer)paVar1;
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,p_Var3[2]._M_nxt,
               (long)&(p_Var3[2]._M_nxt)->_M_nxt + (long)&(p_Var3[3]._M_nxt)->_M_nxt);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Decompiler::get_variable_name(uint16_t index, bool postfix)
{
    std::string s;
    std::unordered_map<uint16_t, std::string>::iterator it = variable_names.find(index);

    if (it == variable_names.end()) {
        char buffer[255];
        s = "v";
        sprintf(buffer, "%d", last_variable_id++);
        s += buffer;
        variable_names[index] = s;

        if (postfix) {
            s += ':';
        }

        out_stream->insert(index, s);

        if (postfix) {
            return s.substr(0, s.length() - 1);
        }

        return s;
    }

    return it->second;
}